

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall A::A(A *this,A *param_1)

{
  A *param_1_local;
  A *this_local;
  
  this->i = param_1->i;
  std::__cxx11::string::string((string *)&this->s,(string *)&param_1->s);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->vi,&param_1->vi);
  std::set<double,_std::less<double>,_std::allocator<double>_>::set(&this->seti,&param_1->seti);
  std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>::vector
            (&this->v,&param_1->v);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(&this->mm,&param_1->mm);
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
		ar & HIBERLITE_NVP(seti);
		ar & HIBERLITE_NVP(i);
		ar & HIBERLITE_NVP(s);
		ar & HIBERLITE_NVP(vi);
		ar & HIBERLITE_NVP(v);
		ar & HIBERLITE_NVP(mm);
	}